

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphical_model.h
# Opt level: O0

int __thiscall
merlin::graphical_model::order_score(graphical_model *this,graph *g,size_t v,OrderMethod kOType)

{
  index i_00;
  index iVar1;
  bool bVar2;
  Type TVar3;
  my_set<merlin::edge_id> *pmVar4;
  _Self *p_Var5;
  reference puVar6;
  edge_id *peVar7;
  pointer peVar8;
  size_t sVar9;
  runtime_error *this_00;
  variable vVar10;
  variable local_228;
  vindex local_218;
  size_t j_5;
  size_t i_5;
  __normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
  local_200;
  const_iterator ci_3;
  my_set<merlin::edge_id> *nlist_3;
  size_t j_4;
  size_t i_4;
  __normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
  local_1d8;
  const_iterator ci_2;
  my_set<merlin::edge_id> *nlist_2;
  size_t local_1c0;
  index local_1b8;
  size_t j_3;
  size_t i_3;
  _Self local_1a0;
  _Base_ptr local_198;
  _Rb_tree_const_iterator<unsigned_long> local_190;
  iterator it2_1;
  iterator it1_1;
  variable_set vs;
  index local_138;
  size_t j_2;
  size_t i_2;
  __normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
  local_120;
  const_iterator ci_1;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> S_1;
  my_set<merlin::edge_id> *nlist_1;
  size_t j_1;
  size_t i_1;
  _Self local_c8;
  _Base_ptr local_c0;
  _Rb_tree_const_iterator<unsigned_long> local_b8;
  iterator it2;
  iterator it1;
  index local_98;
  size_t j;
  size_t i;
  __normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
  local_70;
  const_iterator ci;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> S;
  my_set<merlin::edge_id> *nlist;
  int s;
  size_t v_local;
  graph *g_local;
  graphical_model *this_local;
  OrderMethod kOType_local;
  
  nlist._4_4_ = 0;
  this_local._4_4_ = kOType.t_;
  TVar3 = OrderMethod::operator_cast_to_Type((OrderMethod *)((long)&this_local + 4));
  switch(TVar3) {
  case MinFill:
    pmVar4 = graph::neighbors(g,v);
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)&ci);
    local_70._M_current = (edge_id *)my_set<merlin::edge_id>::begin(pmVar4);
    while( true ) {
      i = (size_t)my_set<merlin::edge_id>::end(pmVar4);
      bVar2 = __gnu_cxx::operator!=
                        (&local_70,
                         (__normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
                          *)&i);
      if (!bVar2) break;
      peVar8 = __gnu_cxx::
               __normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
               ::operator->(&local_70);
      j = peVar8->first;
      peVar8 = __gnu_cxx::
               __normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
               ::operator->(&local_70);
      local_98 = peVar8->second;
      if ((j == v) && (j != local_98)) {
        std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::insert
                  ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                   &ci,&local_98);
      }
      __gnu_cxx::
      __normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
      ::operator++(&local_70);
    }
    std::_Rb_tree_const_iterator<unsigned_long>::_Rb_tree_const_iterator(&it2);
    std::_Rb_tree_const_iterator<unsigned_long>::_Rb_tree_const_iterator(&local_b8);
    local_c0 = (_Base_ptr)
               std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
               begin((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *
                     )&ci);
    it2 = (iterator)local_c0;
    while( true ) {
      local_c8._M_node =
           (_Base_ptr)
           std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::end
                     ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)&ci);
      bVar2 = std::operator!=(&it2,&local_c8);
      if (!bVar2) break;
      local_b8._M_node = it2._M_node;
      while( true ) {
        p_Var5 = std::_Rb_tree_const_iterator<unsigned_long>::operator++(&local_b8);
        i_1 = (size_t)std::
                      set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                      end((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                           *)&ci);
        bVar2 = std::operator!=(p_Var5,(_Self *)&i_1);
        if (!bVar2) break;
        puVar6 = std::_Rb_tree_const_iterator<unsigned_long>::operator*(&it2);
        i_00 = *puVar6;
        puVar6 = std::_Rb_tree_const_iterator<unsigned_long>::operator*(&local_b8);
        peVar7 = graph::edge(g,i_00,*puVar6);
        bVar2 = edge_id::operator==(peVar7,(edge_id *)&edge_id::NO_EDGE);
        if (bVar2) {
          nlist._4_4_ = nlist._4_4_ + 1;
        }
      }
      std::_Rb_tree_const_iterator<unsigned_long>::operator++(&it2);
    }
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)&ci);
    break;
  case WtMinFill:
    pmVar4 = graph::neighbors(g,v);
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)&ci_1
              );
    local_120._M_current = (edge_id *)my_set<merlin::edge_id>::begin(pmVar4);
    while( true ) {
      i_2 = (size_t)my_set<merlin::edge_id>::end(pmVar4);
      bVar2 = __gnu_cxx::operator!=
                        (&local_120,
                         (__normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
                          *)&i_2);
      if (!bVar2) break;
      peVar8 = __gnu_cxx::
               __normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
               ::operator->(&local_120);
      j_2 = peVar8->first;
      peVar8 = __gnu_cxx::
               __normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
               ::operator->(&local_120);
      local_138 = peVar8->second;
      if ((j_2 == v) && (j_2 != local_138)) {
        std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::insert
                  ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                   &ci_1,&local_138);
      }
      __gnu_cxx::
      __normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
      ::operator++(&local_120);
    }
    variable_set::variable_set((variable_set *)&it1_1);
    std::_Rb_tree_const_iterator<unsigned_long>::_Rb_tree_const_iterator(&it2_1);
    std::_Rb_tree_const_iterator<unsigned_long>::_Rb_tree_const_iterator(&local_190);
    local_198 = (_Base_ptr)
                std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                begin((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)&ci_1);
    it2_1 = (iterator)local_198;
    while( true ) {
      local_1a0._M_node =
           (_Base_ptr)
           std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::end
                     ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)&ci_1);
      bVar2 = std::operator!=(&it2_1,&local_1a0);
      if (!bVar2) break;
      local_190._M_node = it2_1._M_node;
      while( true ) {
        p_Var5 = std::_Rb_tree_const_iterator<unsigned_long>::operator++(&local_190);
        i_3 = (size_t)std::
                      set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                      end((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                           *)&ci_1);
        bVar2 = std::operator!=(p_Var5,(_Self *)&i_3);
        if (!bVar2) break;
        puVar6 = std::_Rb_tree_const_iterator<unsigned_long>::operator*(&it2_1);
        j_3 = *puVar6;
        puVar6 = std::_Rb_tree_const_iterator<unsigned_long>::operator*(&local_190);
        local_1b8 = *puVar6;
        peVar7 = graph::edge(g,j_3,local_1b8);
        bVar2 = edge_id::operator==(peVar7,(edge_id *)&edge_id::NO_EDGE);
        if (bVar2) {
          vVar10 = var(this,local_1b8);
          local_1c0 = vVar10.m_states;
          nlist_2 = (my_set<merlin::edge_id> *)vVar10.m_label;
          variable_set::operator|=((variable_set *)&it1_1,(variable *)&nlist_2);
        }
      }
      std::_Rb_tree_const_iterator<unsigned_long>::operator++(&it2_1);
    }
    sVar9 = variable_set::num_states((variable_set *)&it1_1);
    nlist._4_4_ = (int)sVar9;
    variable_set::~variable_set((variable_set *)&it1_1);
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)&ci_1
              );
    break;
  case MinWidth:
    ci_2._M_current = (edge_id *)graph::neighbors(g,v);
    local_1d8._M_current =
         (edge_id *)my_set<merlin::edge_id>::begin((my_set<merlin::edge_id> *)ci_2._M_current);
    while( true ) {
      i_4 = (size_t)my_set<merlin::edge_id>::end((my_set<merlin::edge_id> *)ci_2._M_current);
      bVar2 = __gnu_cxx::operator!=
                        (&local_1d8,
                         (__normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
                          *)&i_4);
      if (!bVar2) break;
      peVar8 = __gnu_cxx::
               __normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
               ::operator->(&local_1d8);
      iVar1 = peVar8->first;
      peVar8 = __gnu_cxx::
               __normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
               ::operator->(&local_1d8);
      if ((iVar1 == v) && (iVar1 != peVar8->second)) {
        nlist._4_4_ = nlist._4_4_ + 1;
      }
      __gnu_cxx::
      __normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
      ::operator++(&local_1d8);
    }
    break;
  case WtMinWidth:
    ci_3._M_current = (edge_id *)graph::neighbors(g,v);
    local_200._M_current =
         (edge_id *)my_set<merlin::edge_id>::begin((my_set<merlin::edge_id> *)ci_3._M_current);
    while( true ) {
      i_5 = (size_t)my_set<merlin::edge_id>::end((my_set<merlin::edge_id> *)ci_3._M_current);
      bVar2 = __gnu_cxx::operator!=
                        (&local_200,
                         (__normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
                          *)&i_5);
      if (!bVar2) break;
      peVar8 = __gnu_cxx::
               __normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
               ::operator->(&local_200);
      j_5 = peVar8->first;
      peVar8 = __gnu_cxx::
               __normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
               ::operator->(&local_200);
      local_218 = peVar8->second;
      if ((j_5 == v) && (j_5 != local_218)) {
        local_228 = var(this,local_218);
        sVar9 = variable::states(&local_228);
        nlist._4_4_ = nlist._4_4_ + (int)sVar9;
      }
      __gnu_cxx::
      __normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
      ::operator++(&local_200);
    }
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Unknown elimination ordering type");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return nlist._4_4_;
}

Assistant:

int order_score(const graph& g, size_t v, OrderMethod kOType) const {
		int s = 0.0;
		switch (kOType) {
		case OrderMethod::MinFill:
			{
				const my_set<edge_id>& nlist = g.neighbors(v);
				std::set<size_t> S;
				for (my_set<edge_id>::const_iterator ci = nlist.begin(); ci != nlist.end(); ++ci) {
					size_t i = ci->first, j = ci->second;
					if (i == v && i != j)
						S.insert(j);
				}
				std::set<size_t>::iterator it1, it2;
				for (it1 = S.begin(); it1 != S.end(); ++it1) {
					it2 = it1;
					while (++it2 != S.end()) {
						size_t i = *it1, j = *it2;
						if (g.edge(i, j) == edge_id::NO_EDGE)
							++s;
					}
				}
				break;
			}
		case OrderMethod::WtMinFill:
			{
				const my_set<edge_id>& nlist = g.neighbors(v);
				std::set<size_t> S;
				for (my_set<edge_id>::const_iterator ci = nlist.begin(); ci != nlist.end(); ++ci) {
					size_t i = ci->first, j = ci->second;
					if (i == v && i != j)
						S.insert(j);
				}
				variable_set vs;
				std::set<size_t>::iterator it1, it2;
				for (it1 = S.begin(); it1 != S.end(); ++it1) {
					it2 = it1;
					while (++it2 != S.end()) {
						size_t i = *it1, j = *it2;
						if (g.edge(i, j) == edge_id::NO_EDGE)
							vs |= var(j);
					}
				}
				s = vs.num_states();
				break;
			}
		case OrderMethod::MinWidth:
			{
				const my_set<edge_id>& nlist = g.neighbors(v);
				for (my_set<edge_id>::const_iterator ci = nlist.begin(); ci != nlist.end(); ++ci) {
					size_t i = ci->first, j = ci->second;
					if (i == v && i != j)
						++s;
				}
				break;
			}
		case OrderMethod::WtMinWidth:
			{
				const my_set<edge_id>& nlist = g.neighbors(v);
				for (my_set<edge_id>::const_iterator ci = nlist.begin(); ci != nlist.end(); ++ci) {
					size_t i = ci->first, j = ci->second;
					if (i == v && i != j)
						s += var(j).states();
				}
				break;
			}
		default:
			throw std::runtime_error("Unknown elimination ordering type");
			break;
		}
		return s;
	}